

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O3

void __thiscall mir::inst::MirFunction::MirFunction(MirFunction *this,MirFunction *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  
  (this->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed478;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (other->name)._M_dataplus._M_p;
  paVar2 = &(other->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(other->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar4;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = (other->name)._M_string_length;
  (other->name)._M_dataplus._M_p = (pointer)paVar2;
  (other->name)._M_string_length = 0;
  (other->name).field_2._M_local_buf[0] = '\0';
  (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (other->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var6 = (other->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (other->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var6;
  (other->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->variables)._M_t._M_impl.super__Rb_tree_header,
             &(other->variables)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->basic_blks)._M_t._M_impl.super__Rb_tree_header,
             &(other->basic_blks)._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

MirFunction(MirFunction&& other) = default;